

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
exe_reconstructor::sectioninfo::sectioninfo
          (sectioninfo *this,string *name,uint64_t size,ReadWriter_ptr *r)

{
  ReadWriter_ptr *r_local;
  uint64_t size_local;
  string *name_local;
  sectioninfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->size = size;
  std::shared_ptr<ReadWriter>::shared_ptr(&this->r,r);
  return;
}

Assistant:

sectioninfo(const std::string &name, uint64_t size, ReadWriter_ptr r)
            : name(name), size(size), r(r)
        {
        }